

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TransferTree(InnerMap *this,void **table,size_type index)

{
  bool bVar1;
  reference ppMVar2;
  size_type b;
  _Self *__x;
  _Self local_58;
  iterator local_50;
  Node *local_38;
  Node *node;
  iterator tree_it;
  Tree *tree;
  size_type index_local;
  void **table_local;
  InnerMap *this_local;
  
  tree_it._M_node = (_Base_ptr)table[index];
  node = (Node *)std::
                 set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                 ::begin((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                          *)tree_it._M_node);
  do {
    ppMVar2 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                        ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)&node);
    local_38 = NodePtrFromKeyPtr(*ppMVar2);
    ppMVar2 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                        ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)&node);
    b = BucketNumber(this,*ppMVar2);
    InsertUnique(&local_50,this,b,local_38);
    __x = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator++
                    ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)&node);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
         ::end(tree_it._M_node);
    bVar1 = std::operator!=(__x,&local_58);
  } while (bVar1);
  DestroyTree(this,(Tree *)tree_it._M_node);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        Node* node = NodePtrFromKeyPtr(*tree_it);
        InsertUnique(BucketNumber(**tree_it), node);
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }